

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::ShaderSubroutine::FunctionalTest3_4::inspectProgramStageiv
          (FunctionalTest3_4 *this,GLuint program_id)

{
  bool bVar1;
  uint local_50;
  GLuint i;
  GLuint n_details;
  inspectionDetails details [5];
  bool local_15;
  bool result;
  GLuint program_id_local;
  FunctionalTest3_4 *this_local;
  
  local_15 = true;
  i = 0x8de6;
  n_details = this->m_n_active_subroutine_uniforms;
  details[0].pname = 0x8e47;
  details[0].expected_value = this->m_n_active_subroutine_uniform_locations;
  details[1].pname = 0x8de5;
  details[1].expected_value = this->m_n_active_subroutines;
  details[2].pname = 0x8e49;
  details[2].expected_value = this->m_n_active_subroutine_uniform_name_length + 1;
  details[3].pname = 0x8e48;
  details[3].expected_value = this->m_n_active_subroutine_name_length + 1;
  for (local_50 = 0; local_50 < 5; local_50 = local_50 + 1) {
    bVar1 = checkProgramStageiv(this,program_id,(&i)[(ulong)local_50 * 2],
                                details[(ulong)local_50 - 1].expected_value);
    if (!bVar1) {
      local_15 = false;
    }
  }
  return local_15;
}

Assistant:

bool FunctionalTest3_4::inspectProgramStageiv(glw::GLuint program_id) const
{
	bool result = true;

	const inspectionDetails details[] = {
		{ GL_ACTIVE_SUBROUTINE_UNIFORMS, m_n_active_subroutine_uniforms },
		{ GL_ACTIVE_SUBROUTINE_UNIFORM_LOCATIONS, m_n_active_subroutine_uniform_locations },
		{ GL_ACTIVE_SUBROUTINES, m_n_active_subroutines },
		{ GL_ACTIVE_SUBROUTINE_UNIFORM_MAX_LENGTH, m_n_active_subroutine_uniform_name_length + 1 },
		{ GL_ACTIVE_SUBROUTINE_MAX_LENGTH, m_n_active_subroutine_name_length + 1 }
	};
	const GLuint n_details = sizeof(details) / sizeof(details[0]);

	for (GLuint i = 0; i < n_details; ++i)
	{
		if (false == checkProgramStageiv(program_id, details[i].pname, details[i].expected_value))
		{
			result = false;
		}
	}

	return result;
}